

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O2

int __thiscall de::Socket::shutdown(Socket *this,int __fd,int __how)

{
  SocketError *this_00;
  deBool dVar1;
  allocator<char> local_39;
  string local_38;
  
  dVar1 = deSocket_shutdown(this->m_socket,3);
  if (dVar1 != 0) {
    return dVar1;
  }
  this_00 = (SocketError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Socket shutdown failed",&local_39);
  SocketError::SocketError(this_00,&local_38);
  __cxa_throw(this_00,&SocketError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::shutdown (void)
{
	if (!deSocket_shutdown(m_socket, DE_SOCKETCHANNEL_BOTH))
		throw SocketError("Socket shutdown failed");
}